

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O0

void __thiscall
Outputs::Display::OpenGL::Rectangle::Rectangle
          (Rectangle *this,float x,float y,float width,float height)

{
  GLint GVar1;
  uint uVar2;
  ostream *poVar3;
  socklen_t __len;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  *this_00;
  sockaddr *__addr;
  int __fd;
  string *vertex_shader;
  GLenum error_7;
  GLenum error_6;
  float buffer [8];
  string local_100;
  uint local_dc;
  uint local_d8;
  GLenum error_5;
  GLenum error_4;
  GLint local_ac;
  uint local_a8;
  GLint position_attribute;
  GLenum error_3;
  GLenum error_2;
  GLenum error_1;
  GLenum error;
  pointer pAStack_90;
  pointer local_88;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  float local_20;
  float local_1c;
  float height_local;
  float width_local;
  float y_local;
  float x_local;
  Rectangle *this_local;
  
  local_20 = height;
  local_1c = width;
  height_local = y;
  width_local = x;
  _y_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "#version 150\nin vec2 position;void main(void){gl_Position = vec4(position, 0.0, 1.0);}"
             ,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 150\nuniform vec4 colour;out vec4 fragColour;void main(void){fragColour = colour;}"
             ,&local_79);
  _error_1 = (pointer)0x0;
  pAStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  this_00 = (vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
             *)&error_1;
  std::
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ::vector(this_00);
  vertex_shader = &local_40;
  Shader::Shader(&this->pixel_shader_,vertex_shader,&local_78,this_00);
  __len = (socklen_t)this_00;
  __fd = (int)vertex_shader;
  std::
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ::~vector((vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
             *)&error_1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this->drawing_vertex_array_ = 0;
  this->drawing_array_buffer_ = 0;
  Shader::bind(&this->pixel_shader_,__fd,__addr,__len);
  glGenVertexArrays(1,&this->drawing_vertex_array_);
  error_2 = glGetError();
  if (error_2 != 0) {
    switch(error_2) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,error_2);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x24,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  glGenBuffers(1,&this->drawing_array_buffer_);
  error_3 = glGetError();
  if (error_3 != 0) {
    switch(error_3) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,error_3);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x25,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  glBindVertexArray(this->drawing_vertex_array_);
  position_attribute = glGetError();
  if (position_attribute != 0) {
    switch(position_attribute) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,position_attribute);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x27,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  glBindBuffer(0x8892,this->drawing_array_buffer_);
  local_a8 = glGetError();
  if (local_a8 != 0) {
    switch(local_a8) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,local_a8);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x28,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error_4,"position",(allocator<char> *)((long)&error_5 + 3));
  GVar1 = Shader::get_attrib_location(&this->pixel_shader_,(string *)&error_4);
  std::__cxx11::string::~string((string *)&error_4);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error_5 + 3));
  local_ac = GVar1;
  glEnableVertexAttribArray(GVar1);
  local_d8 = glGetError();
  if (local_d8 != 0) {
    switch(local_d8) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,local_d8);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2b);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x2b,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  glVertexAttribPointer(local_ac,2,0x1406,0,8,0);
  local_dc = glGetError();
  if (local_dc != 0) {
    switch(local_dc) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,local_dc);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x33,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"colour",(allocator<char> *)((long)buffer + 0x1f));
  GVar1 = Shader::get_uniform_location(&this->pixel_shader_,&local_100);
  this->colour_uniform_ = GVar1;
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)buffer + 0x1f));
  error_7 = (GLenum)width_local;
  error_6 = (GLenum)height_local;
  buffer[0] = width_local;
  buffer[1] = height_local + local_20;
  buffer[2] = width_local + local_1c;
  buffer[3] = height_local;
  buffer[4] = width_local + local_1c;
  buffer[5] = height_local + local_20;
  glBindBuffer(0x8892,this->drawing_array_buffer_);
  uVar2 = glGetError();
  if (uVar2 != 0) {
    switch(uVar2) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x40);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x40,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  glBufferData(0x8892,0x20,&error_7,0x88e4);
  uVar2 = glGetError();
  if (uVar2 != 0) {
    switch(uVar2) {
    case 0x500:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_ENUM");
      break;
    case 0x501:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_VALUE");
      break;
    case 0x502:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_OPERATION");
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case 0x505:
      std::operator<<((ostream *)&std::cerr,"GL_OUT_OF_MEMORY");
      break;
    case 0x506:
      std::operator<<((ostream *)&std::cerr,"GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x41);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x41,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  return;
}

Assistant:

Rectangle::Rectangle(float x, float y, float width, float height):
	pixel_shader_(
		"#version 150\n"

		"in vec2 position;"

		"void main(void)"
		"{"
			"gl_Position = vec4(position, 0.0, 1.0);"
		"}",

		"#version 150\n"

		"uniform vec4 colour;"
		"out vec4 fragColour;"

		"void main(void)"
		"{"
			"fragColour = colour;"
		"}"
	){
	pixel_shader_.bind();

	test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
	test_gl(glGenBuffers, 1, &drawing_array_buffer_);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

	GLint position_attribute = pixel_shader_.get_attrib_location("position");
	test_gl(glEnableVertexAttribArray, GLuint(position_attribute));

	test_gl(glVertexAttribPointer,
		(GLuint)position_attribute,
		2,
		GL_FLOAT,
		GL_FALSE,
		2 * sizeof(GLfloat),
		(void *)0);

	colour_uniform_ = pixel_shader_.get_uniform_location("colour");

	float buffer[4*2];

	// Store positions.
	buffer[0] = x;			buffer[1] = y;
	buffer[2] = x;			buffer[3] = y + height;
	buffer[4] = x + width;	buffer[5] = y;
	buffer[6] = x + width;	buffer[7] = y + height;

	// Upload buffer.
	test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
	test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
}